

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules2.cpp
# Opt level: O1

void opengv::relative_pose::modules::sixpt::fillRow1
               (Matrix<double,_6,_1,_0,_6,_1> *l01,Matrix<double,_6,_1,_0,_6,_1> *l02,
               Matrix<double,_6,_1,_0,_6,_1> *l11,Matrix<double,_6,_1,_0,_6,_1> *l12,
               vector<double,_std::allocator<double>_> *c0,
               vector<double,_std::allocator<double>_> *c1,
               vector<double,_std::allocator<double>_> *c2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  iterator iVar65;
  double dVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  double local_50;
  undefined1 local_48 [16];
  
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  dVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar270._8_8_ = 0;
  auVar270._0_8_ = dVar4;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar1 * dVar2 * dVar4;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar3 * dVar1;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar72,auVar71);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar5 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar347._8_8_ = 0;
  auVar347._0_8_ = dVar4 * dVar5;
  auVar69 = vfmadd213sd_fma(auVar347,auVar72,auVar69);
  auVar227._8_8_ = 0;
  auVar227._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar2 * dVar4;
  auVar69 = vfnmadd213sd_fma(auVar67,auVar227,auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar5 * dVar1;
  auVar69 = vfmadd213sd_fma(auVar70,auVar270,auVar69);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar3 * dVar1;
  auVar69 = vfnmadd213sd_fma(auVar68,auVar227,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c0,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar228._8_8_ = 0;
  auVar228._0_8_ = dVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar120._8_8_ = 0;
  auVar120._0_8_ =
       dVar2 * -2.0 *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
       * dVar4;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = (dVar2 + dVar2) * dVar3;
  auVar69 = vfmadd231sd_fma(auVar120,auVar148,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = dVar3 * dVar1 * -2.0;
  auVar69 = vfmadd132sd_fma(auVar149,auVar69,auVar11);
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       (dVar1 + dVar1) *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar69 = vfmadd213sd_fma(auVar73,auVar228,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c0,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar229._8_8_ = 0;
  auVar229._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  dVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar271._8_8_ = 0;
  auVar271._0_8_ = dVar4;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar1 * dVar2 * dVar4;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = dVar3 * dVar1;
  auVar69 = vfnmadd231sd_fma(auVar74,auVar229,auVar187);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar5 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar348._8_8_ = 0;
  auVar348._0_8_ = dVar5 * dVar4;
  auVar69 = vfnmadd213sd_fma(auVar348,auVar229,auVar69);
  auVar121._8_8_ = 0;
  auVar121._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar2 * dVar4;
  auVar69 = vfmadd213sd_fma(auVar75,auVar121,auVar69);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = dVar5 * dVar1;
  auVar69 = vfnmadd213sd_fma(auVar230,auVar271,auVar69);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar3 * dVar1;
  auVar69 = vfmadd213sd_fma(auVar76,auVar121,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c0,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar188._8_8_ = 0;
  auVar188._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar122._8_8_ = 0;
  auVar122._0_8_ =
       dVar2 * -2.0 * dVar3 *
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       (dVar2 + dVar2) *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar69 = vfmadd231sd_fma(auVar122,auVar188,auVar150);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = dVar3 * (dVar1 + dVar1);
  auVar69 = vfmadd132sd_fma(auVar151,auVar69,auVar12);
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       dVar1 * -2.0 *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar69 = vfmadd213sd_fma(auVar77,auVar188,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c0,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar189._8_8_ = 0;
  auVar189._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar123._8_8_ = 0;
  auVar123._0_8_ =
       (dVar2 + dVar2) * dVar3 *
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar152._8_8_ = 0;
  auVar152._0_8_ =
       dVar2 * -2.0 *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar69 = vfmadd231sd_fma(auVar123,auVar189,auVar152);
  auVar153._8_8_ = 0;
  auVar153._0_8_ =
       (dVar1 + dVar1) *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar69 = vfmadd213sd_fma(auVar153,auVar189,auVar69);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar3 * dVar1 * -2.0;
  auVar69 = vfmadd132sd_fma(auVar78,auVar69,auVar13);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c0,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar231._8_8_ = 0;
  auVar231._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  dVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar272._8_8_ = 0;
  auVar272._0_8_ = dVar4;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar2 * dVar1 * dVar4;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = dVar1 * dVar3;
  auVar69 = vfmsub231sd_fma(auVar79,auVar231,auVar190);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar5 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar349._8_8_ = 0;
  auVar349._0_8_ = dVar4 * dVar5;
  auVar69 = vfmadd213sd_fma(auVar349,auVar231,auVar69);
  auVar232._8_8_ = 0;
  auVar232._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar2 * dVar4;
  auVar69 = vfnmadd213sd_fma(auVar80,auVar232,auVar69);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = dVar5 * dVar1;
  auVar69 = vfnmadd213sd_fma(auVar124,auVar272,auVar69);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar3 * dVar1;
  auVar69 = vfmadd213sd_fma(auVar81,auVar232,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c0,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar191._8_8_ = 0;
  auVar191._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar125._8_8_ = 0;
  auVar125._0_8_ =
       (dVar2 + dVar2) * dVar3 *
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar154._8_8_ = 0;
  auVar154._0_8_ =
       dVar2 * -2.0 *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar69 = vfmadd231sd_fma(auVar125,auVar191,auVar154);
  auVar155._8_8_ = 0;
  auVar155._0_8_ =
       dVar1 * -2.0 *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar69 = vfmadd213sd_fma(auVar155,auVar191,auVar69);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar3 * (dVar1 + dVar1);
  auVar69 = vfmadd132sd_fma(auVar82,auVar69,auVar14);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c0,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar192._8_8_ = 0;
  auVar192._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar126._8_8_ = 0;
  auVar126._0_8_ =
       (dVar2 + dVar2) * dVar3 *
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar156._8_8_ = 0;
  auVar156._0_8_ =
       dVar2 * -2.0 *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar69 = vfmadd231sd_fma(auVar126,auVar192,auVar156);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = dVar3 * (dVar1 + dVar1);
  auVar69 = vfmadd132sd_fma(auVar157,auVar69,auVar15);
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       dVar1 * -2.0 *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar69 = vfmadd213sd_fma(auVar83,auVar192,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c0,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar233._8_8_ = 0;
  auVar233._0_8_ = dVar4;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar127._8_8_ = 0;
  auVar127._0_8_ =
       dVar2 * -2.0 *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
       * dVar4;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = (dVar2 + dVar2) * dVar3;
  auVar69 = vfmadd231sd_fma(auVar127,auVar158,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = dVar3 * (dVar1 + dVar1);
  auVar69 = vfmadd132sd_fma(auVar159,auVar69,auVar17);
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       dVar1 * -2.0 *
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar69 = vfmadd213sd_fma(auVar84,auVar233,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c0,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar234._8_8_ = 0;
  auVar234._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  dVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar273._8_8_ = 0;
  auVar273._0_8_ = dVar4;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar2 * dVar1 * dVar4;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = dVar1 * dVar3;
  auVar69 = vfmsub231sd_fma(auVar85,auVar234,auVar193);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar5 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar350._8_8_ = 0;
  auVar350._0_8_ = dVar5 * dVar4;
  auVar69 = vfnmadd213sd_fma(auVar350,auVar234,auVar69);
  auVar128._8_8_ = 0;
  auVar128._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar2 * dVar4;
  auVar69 = vfmadd213sd_fma(auVar86,auVar128,auVar69);
  auVar235._8_8_ = 0;
  auVar235._0_8_ = dVar5 * dVar1;
  auVar69 = vfmadd213sd_fma(auVar235,auVar273,auVar69);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar3 * dVar1;
  auVar69 = vfnmadd213sd_fma(auVar87,auVar128,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c0,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar236._8_8_ = 0;
  auVar236._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar274._8_8_ = 0;
  auVar274._0_8_ = dVar4;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar1 * dVar2 * dVar4;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = dVar1 * dVar3;
  auVar69 = vfmadd231sd_fma(auVar88,auVar236,auVar194);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar5 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar351._8_8_ = 0;
  auVar351._0_8_ = dVar5 * dVar4;
  auVar69 = vfnmadd213sd_fma(auVar351,auVar236,auVar69);
  auVar237._8_8_ = 0;
  auVar237._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar2 * dVar4;
  auVar69 = vfnmadd213sd_fma(auVar89,auVar237,auVar69);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = dVar5 * dVar1;
  auVar69 = vfmadd213sd_fma(auVar129,auVar274,auVar69);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar3 * dVar1;
  auVar69 = vfnmadd213sd_fma(auVar90,auVar237,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c1,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar130._8_8_ = 0;
  auVar130._0_8_ =
       dVar2 * -2.0 * dVar3 *
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = (dVar2 + dVar2) * dVar4;
  auVar69 = vfmadd231sd_fma(auVar130,auVar160,auVar18);
  auVar161._8_8_ = 0;
  auVar161._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar238._8_8_ = 0;
  auVar238._0_8_ =
       dVar4 * (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array[1] * -2.0;
  auVar69 = vfmadd213sd_fma(auVar238,auVar161,auVar69);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar3 * (dVar1 + dVar1);
  auVar69 = vfmadd213sd_fma(auVar91,auVar161,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c1,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar239._8_8_ = 0;
  auVar239._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar275._8_8_ = 0;
  auVar275._0_8_ = dVar4;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar2 * dVar1 * dVar4;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = dVar3 * dVar1;
  auVar69 = vfnmsub231sd_fma(auVar92,auVar239,auVar195);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar5 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar352._8_8_ = 0;
  auVar352._0_8_ = dVar5 * dVar4;
  auVar69 = vfnmadd213sd_fma(auVar352,auVar239,auVar69);
  auVar131._8_8_ = 0;
  auVar131._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar2 * dVar4;
  auVar69 = vfmadd213sd_fma(auVar93,auVar131,auVar69);
  auVar240._8_8_ = 0;
  auVar240._0_8_ = dVar5 * dVar1;
  auVar69 = vfmadd213sd_fma(auVar240,auVar275,auVar69);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar3 * dVar1;
  auVar69 = vfmadd213sd_fma(auVar94,auVar131,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c1,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar241._8_8_ = 0;
  auVar241._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = (dVar2 + dVar2) * dVar4;
  auVar196._8_8_ = 0;
  auVar196._0_8_ =
       dVar4 * dVar1 * -2.0 *
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar69 = vfmadd231sd_fma(auVar196,auVar241,auVar132);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = (dVar1 + dVar1) * dVar3;
  auVar69 = vfmadd132sd_fma(auVar133,auVar69,auVar19);
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       dVar3 * (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array[0] * -2.0;
  auVar69 = vfmadd213sd_fma(auVar95,auVar241,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c1,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar197._8_8_ = 0;
  auVar197._0_8_ = dVar3;
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar5 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
       * -2.0 * dVar2;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = dVar3 * (dVar5 + dVar5) * dVar1;
  auVar69 = vfmadd231sd_fma(auVar276,auVar197,auVar96);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar2 * (dVar4 + dVar4);
  auVar69 = vfmadd132sd_fma(auVar162,auVar69,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar1 * dVar4 * -2.0;
  auVar69 = vfmadd132sd_fma(auVar97,auVar69,auVar21);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c1,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar242._8_8_ = 0;
  auVar242._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar277._8_8_ = 0;
  auVar277._0_8_ = dVar4;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar2 * dVar1 * dVar4;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = dVar1 * dVar3;
  auVar69 = vfmsub231sd_fma(auVar98,auVar242,auVar198);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar5 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar353._8_8_ = 0;
  auVar353._0_8_ = dVar4 * dVar5;
  auVar69 = vfmadd213sd_fma(auVar353,auVar242,auVar69);
  auVar134._8_8_ = 0;
  auVar134._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar2 * dVar4;
  auVar69 = vfmadd213sd_fma(auVar99,auVar134,auVar69);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = dVar5 * dVar1;
  auVar69 = vfnmadd213sd_fma(auVar243,auVar277,auVar69);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar3 * dVar1;
  auVar69 = vfnmadd213sd_fma(auVar100,auVar134,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c1,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar199._8_8_ = 0;
  auVar199._0_8_ = dVar4;
  dVar5 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar101._8_8_ = 0;
  auVar101._0_8_ = (dVar1 + dVar1) * dVar3;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = dVar4 * (dVar5 + dVar5) * dVar2;
  auVar69 = vfmadd231sd_fma(auVar278,auVar199,auVar101);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0] * -2.0;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = dVar3 * dVar1;
  auVar69 = vfmadd132sd_fma(auVar163,auVar69,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar2 * dVar1;
  auVar69 = vfmadd132sd_fma(auVar102,auVar69,auVar23);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c1,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar200._8_8_ = 0;
  auVar200._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar5 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1] * -2.0;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = (dVar1 + dVar1) * dVar3;
  auVar164._8_8_ = 0;
  auVar164._0_8_ =
       dVar3 * dVar5 *
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar69 = vfmadd231sd_fma(auVar164,auVar200,auVar103);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = dVar5 * dVar2;
  auVar69 = vfmadd132sd_fma(auVar279,auVar69,auVar24);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar2 * (dVar4 + dVar4);
  auVar69 = vfmadd213sd_fma(auVar104,auVar200,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c1,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar3 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2] * -2.0;
  dVar1 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar105._8_8_ = 0;
  auVar105._0_8_ =
       dVar3 * dVar1 *
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = dVar3 * dVar2;
  auVar69 = vfmadd231sd_fma(auVar105,auVar201,auVar25);
  dVar3 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar244._8_8_ = 0;
  auVar244._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = dVar2 * (dVar4 + dVar4);
  auVar69 = vfmadd213sd_fma(auVar165,auVar244,auVar69);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar1 * (dVar3 + dVar3);
  auVar69 = vfmadd213sd_fma(auVar106,auVar244,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c1,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar245._8_8_ = 0;
  auVar245._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar280._8_8_ = 0;
  auVar280._0_8_ = dVar4;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar1 * dVar2 * dVar4;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = dVar3 * dVar1;
  auVar69 = vfnmadd231sd_fma(auVar107,auVar245,auVar202);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar5 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar354._8_8_ = 0;
  auVar354._0_8_ = dVar4 * dVar5;
  auVar69 = vfmadd213sd_fma(auVar354,auVar245,auVar69);
  auVar246._8_8_ = 0;
  auVar246._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar2 * dVar4;
  auVar69 = vfnmadd213sd_fma(auVar108,auVar246,auVar69);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar5 * dVar1;
  auVar69 = vfnmadd213sd_fma(auVar135,auVar280,auVar69);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar3 * dVar1;
  auVar69 = vfmadd213sd_fma(auVar109,auVar246,auVar69);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c1,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar110._8_8_ = 0;
  auVar110._0_8_ = dVar1;
  local_48 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar67 = vxorpd_avx512vl(auVar110,local_48);
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar136._8_8_ = 0;
  auVar136._0_8_ = dVar2;
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar166._8_8_ = 0;
  auVar166._0_8_ = dVar3;
  dVar66 = auVar67._0_8_ * dVar3;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar390._8_8_ = 0;
  auVar390._0_8_ = dVar4;
  auVar247._8_8_ = 0;
  auVar247._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar203._8_8_ = 0;
  auVar203._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  dVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar324._8_8_ = 0;
  auVar324._0_8_ = dVar5;
  dVar6 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar403._8_8_ = 0;
  auVar403._0_8_ = dVar6;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = dVar66 * dVar4;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = dVar1 * dVar3 * dVar5 * dVar6;
  auVar69 = vfmadd231sd_fma(auVar355,auVar203,auVar281);
  dVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar440._8_8_ = 0;
  auVar440._0_8_ = dVar4;
  auVar299._8_8_ = 0;
  auVar299._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar282._8_8_ = 0;
  auVar282._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = dVar4 * dVar1 * dVar3;
  auVar69 = vfmadd213sd_fma(auVar461,auVar282,auVar69);
  dVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar356._8_8_ = 0;
  auVar356._0_8_ = dVar6;
  auVar449._8_8_ = 0;
  auVar449._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = dVar66 * dVar6;
  auVar69 = vfmadd213sd_fma(auVar424,auVar449,auVar69);
  auVar462._8_8_ = 0;
  auVar462._0_8_ = dVar1 * dVar2;
  auVar68 = vmulsd_avx512f(auVar390,auVar462);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar247,auVar69);
  dVar66 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[3];
  auVar375._8_8_ = 0;
  auVar375._0_8_ = auVar67._0_8_ * dVar2;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = dVar66;
  auVar67 = vmulsd_avx512f(auVar375,auVar494);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar403,auVar69);
  auVar463._8_8_ = 0;
  auVar463._0_8_ = dVar4 * dVar1 * dVar2;
  auVar69 = vfmadd213sd_fma(auVar463,auVar299,auVar69);
  dVar1 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar481._8_8_ = 0;
  auVar481._0_8_ = dVar1;
  auVar67 = vmulsd_avx512f(auVar375,auVar481);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar449,auVar69);
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar376._8_8_ = 0;
  auVar376._0_8_ = dVar2;
  auVar425._8_8_ = 0;
  auVar425._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar464._8_8_ = 0;
  auVar464._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar67 = vmulsd_avx512f(auVar425,auVar464);
  auVar68 = vmulsd_avx512f(auVar390,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar203,auVar69);
  auVar68 = vxorpd_avx512vl(auVar425,local_48);
  auVar70 = vmulsd_avx512f(auVar464,auVar68);
  auVar71 = vmulsd_avx512f(auVar324,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar71,auVar403,auVar69);
  auVar70 = vmulsd_avx512f(auVar440,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar282,auVar69);
  auVar67 = vmulsd_avx512f(auVar356,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar449,auVar69);
  auVar67 = vmulsd_avx512f(auVar136,auVar425);
  auVar70 = vmulsd_avx512f(auVar324,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar247,auVar69);
  auVar68 = vmulsd_avx512f(auVar136,auVar68);
  auVar70 = vmulsd_avx512f(auVar494,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar203,auVar69);
  auVar67 = vmulsd_avx512f(auVar356,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar299,auVar69);
  auVar67 = vmulsd_avx512f(auVar481,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar282,auVar69);
  auVar67 = vmulsd_avx512f(auVar464,auVar376);
  auVar68 = vmulsd_avx512f(auVar390,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar247,auVar69);
  auVar68 = vxorpd_avx512vl(auVar376,local_48);
  auVar70 = vmulsd_avx512f(auVar464,auVar68);
  auVar495._8_8_ = 0;
  auVar495._0_8_ = dVar66;
  auVar71 = vmulsd_avx512f(auVar495,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar71,auVar403,auVar69);
  auVar67 = vmulsd_avx512f(auVar440,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar299,auVar69);
  auVar482._8_8_ = 0;
  auVar482._0_8_ = dVar1;
  auVar67 = vmulsd_avx512f(auVar482,auVar70);
  auVar69 = vfmadd213sd_fma(auVar67,auVar449,auVar69);
  dVar2 = dVar2 * dVar3;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = dVar2 * dVar5;
  auVar69 = vfmadd213sd_fma(auVar325,auVar247,auVar69);
  auVar67 = vmulsd_avx512f(auVar166,auVar68);
  auVar68 = vmulsd_avx512f(auVar495,auVar67);
  auVar69 = vfmadd213sd_fma(auVar68,auVar203,auVar69);
  auVar326._8_8_ = 0;
  auVar326._0_8_ = dVar6 * dVar2;
  auVar69 = vfmadd213sd_fma(auVar326,auVar299,auVar69);
  auVar67 = vmulsd_avx512f(auVar482,auVar67);
  auVar69 = vfmadd213sd_fma(auVar67,auVar282,auVar69);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar464,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar166,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar136,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar110,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar425,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar376,auVar31);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c2,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar204._8_8_ = 0;
  auVar204._0_8_ = dVar1;
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar137._8_8_ = 0;
  auVar137._0_8_ = dVar2;
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar3;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  dVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar167._8_8_ = 0;
  auVar167._0_8_ = dVar5;
  dVar6 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar327._8_8_ = 0;
  auVar327._0_8_ = dVar6;
  auVar67 = vmulsd_avx512f(auVar204,ZEXT816(0xc000000000000000));
  auVar377._8_8_ = 0;
  auVar377._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar391._8_8_ = 0;
  auVar391._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = (dVar1 + dVar1) * dVar3 * dVar4;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = auVar67._0_8_ * dVar3 * dVar5 * dVar6;
  auVar69 = vfmadd231sd_fma(auVar357,auVar377,auVar300);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = dVar4 * (dVar1 + dVar1) * dVar2;
  auVar69 = vfmadd213sd_fma(auVar248,auVar391,auVar69);
  dVar1 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar283._8_8_ = 0;
  auVar283._0_8_ = dVar1;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = auVar67._0_8_ * dVar2 * dVar1;
  auVar69 = vfmadd213sd_fma(auVar205,auVar327,auVar69);
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar249._8_8_ = 0;
  auVar249._0_8_ = dVar4;
  dVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar301._8_8_ = 0;
  auVar301._0_8_ = dVar6;
  dVar6 = dVar6 + dVar6;
  dVar66 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[2];
  auVar358._8_8_ = 0;
  auVar358._0_8_ = dVar66;
  dVar7 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar426._8_8_ = 0;
  auVar426._0_8_ = dVar7;
  auVar441._8_8_ = 0;
  auVar441._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar450._8_8_ = 0;
  auVar450._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = dVar66 * dVar6 * dVar7;
  auVar69 = vfmadd213sd_fma(auVar404,auVar441,auVar69);
  dVar7 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar206._8_8_ = 0;
  auVar206._0_8_ = dVar7;
  auVar465._8_8_ = 0;
  auVar465._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar67 = vmulsd_avx512f(auVar301,ZEXT816(0xc000000000000000));
  auVar68 = vmulsd_avx512f(auVar67,auVar358);
  auVar68 = vmulsd_avx512f(auVar68,auVar206);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar465,auVar69);
  auVar405._8_8_ = 0;
  auVar405._0_8_ = dVar3 * dVar6;
  auVar68 = vmulsd_avx512f(auVar283,auVar405);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar377,auVar69);
  dVar3 = dVar3 * auVar67._0_8_;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = dVar3;
  auVar67 = vmulsd_avx512f(auVar167,auVar302);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar391,auVar69);
  dVar8 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar496._8_8_ = 0;
  auVar496._0_8_ = dVar8;
  auVar67 = vmulsd_avx512f(auVar405,auVar496);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar441,auVar69);
  auVar303._8_8_ = 0;
  auVar303._0_8_ = dVar3 * dVar7;
  auVar69 = vfmadd213sd_fma(auVar303,auVar450,auVar69);
  auVar406._8_8_ = 0;
  auVar406._0_8_ = dVar4 + dVar4;
  auVar67 = vmulsd_avx512f(auVar358,auVar406);
  auVar67 = vmulsd_avx512f(auVar426,auVar67);
  auVar69 = vfmadd213sd_fma(auVar67,auVar450,auVar69);
  auVar67 = vmulsd_avx512f(auVar249,ZEXT816(0xc000000000000000));
  auVar304._8_8_ = 0;
  auVar304._0_8_ = dVar66 * auVar67._0_8_;
  auVar68 = vmulsd_avx512f(auVar496,auVar304);
  auVar69 = vfmadd213sd_fma(auVar68,auVar465,auVar69);
  dVar3 = dVar2 * auVar67._0_8_;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = dVar1 * dVar3;
  auVar69 = vfmadd213sd_fma(auVar284,auVar377,auVar69);
  dVar2 = (dVar4 + dVar4) * dVar2;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar5 * dVar2;
  auVar69 = vfmadd213sd_fma(auVar168,auVar391,auVar69);
  auVar250._8_8_ = 0;
  auVar250._0_8_ = dVar3;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = dVar8;
  auVar67 = vmulsd_avx512f(auVar497,auVar250);
  auVar69 = vfmadd213sd_fma(auVar67,auVar441,auVar69);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = dVar7 * dVar2;
  auVar69 = vfmadd213sd_fma(auVar169,auVar450,auVar69);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar207._8_8_ = 0;
  auVar207._0_8_ = dVar1 + dVar1;
  auVar69 = vfmadd213sd_fma(auVar207,auVar137,auVar69);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar138._8_8_ = 0;
  auVar138._0_8_ = dVar1 + dVar1;
  auVar69 = vfmadd213sd_fma(auVar138,auVar111,auVar69);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = dVar6;
  auVar69 = vfmadd231sd_fma(auVar69,auVar328,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar406,auVar33);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c2,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar1;
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar139._8_8_ = 0;
  auVar139._0_8_ = dVar2;
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar170._8_8_ = 0;
  auVar170._0_8_ = dVar3;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar392._8_8_ = 0;
  auVar392._0_8_ = dVar4;
  auVar251._8_8_ = 0;
  auVar251._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar208._8_8_ = 0;
  auVar208._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  dVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar305._8_8_ = 0;
  auVar305._0_8_ = dVar5;
  dVar6 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar378._8_8_ = 0;
  auVar378._0_8_ = dVar6;
  auVar67 = vxorpd_avx512vl(auVar112,local_48);
  dVar7 = auVar67._0_8_ * dVar3;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = dVar4 * dVar1 * dVar3;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = dVar7 * dVar5 * dVar6;
  auVar69 = vfmadd231sd_fma(auVar359,auVar208,auVar329);
  dVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar442._8_8_ = 0;
  auVar442._0_8_ = dVar6;
  auVar330._8_8_ = 0;
  auVar330._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar285._8_8_ = 0;
  auVar285._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = dVar6 * dVar1 * dVar3;
  auVar69 = vfmadd213sd_fma(auVar466,auVar285,auVar69);
  dVar66 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[4];
  auVar360._8_8_ = 0;
  auVar360._0_8_ = dVar66;
  auVar451._8_8_ = 0;
  auVar451._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar427._8_8_ = 0;
  auVar427._0_8_ = dVar7 * dVar66;
  auVar69 = vfmadd213sd_fma(auVar427,auVar451,auVar69);
  dVar7 = auVar67._0_8_ * dVar2;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = dVar4 * dVar7;
  auVar69 = vfmadd213sd_fma(auVar467,auVar251,auVar69);
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar428._8_8_ = 0;
  auVar428._0_8_ = dVar1 * dVar2;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = dVar4;
  auVar67 = vmulsd_avx512f(auVar428,auVar483);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar378,auVar69);
  auVar429._8_8_ = 0;
  auVar429._0_8_ = dVar6 * dVar1 * dVar2;
  auVar69 = vfmadd213sd_avx512f(auVar429,auVar330,auVar69);
  dVar1 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar468._8_8_ = 0;
  auVar468._0_8_ = dVar1;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = dVar7;
  auVar67 = vmulsd_avx512f(auVar407,auVar468);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar451,auVar69);
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar408._8_8_ = 0;
  auVar408._0_8_ = dVar2;
  auVar430._8_8_ = 0;
  auVar430._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  dVar6 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar507._8_8_ = 0;
  auVar507._0_8_ = dVar6;
  auVar67 = vmulsd_avx512f(auVar430,auVar507);
  auVar68 = vmulsd_avx512f(auVar392,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar208,auVar69);
  auVar68 = vxorpd_avx512vl(auVar430,local_48);
  auVar70 = vmulsd_avx512f(auVar507,auVar68);
  auVar71 = vmulsd_avx512f(auVar305,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar71,auVar378,auVar69);
  auVar67 = vmulsd_avx512f(auVar442,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar285,auVar69);
  auVar67 = vmulsd_avx512f(auVar360,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar451,auVar69);
  auVar67 = vmulsd_avx512f(auVar139,auVar68);
  auVar68 = vmulsd_avx512f(auVar305,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar251,auVar69);
  auVar68 = vmulsd_avx512f(auVar139,auVar430);
  auVar70 = vmulsd_avx512f(auVar483,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar208,auVar69);
  auVar67 = vmulsd_avx512f(auVar360,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar330,auVar69);
  auVar67 = vmulsd_avx512f(auVar468,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar285,auVar69);
  auVar508._8_8_ = 0;
  auVar508._0_8_ = dVar6;
  auVar67 = vmulsd_avx512f(auVar508,auVar408);
  auVar68 = vmulsd_avx512f(auVar392,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar251,auVar69);
  auVar68 = vxorpd_avx512vl(auVar408,local_48);
  auVar70 = vmulsd_avx512f(auVar508,auVar68);
  auVar484._8_8_ = 0;
  auVar484._0_8_ = dVar4;
  auVar71 = vmulsd_avx512f(auVar484,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar71,auVar378,auVar69);
  auVar70 = vmulsd_avx512f(auVar442,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar330,auVar69);
  auVar67 = vmulsd_avx512f(auVar468,auVar67);
  auVar69 = vfmadd213sd_fma(auVar67,auVar451,auVar69);
  auVar67 = vmulsd_avx512f(auVar170,auVar68);
  auVar306._8_8_ = 0;
  auVar306._0_8_ = auVar67._0_8_ * dVar5;
  auVar69 = vfmadd213sd_fma(auVar306,auVar251,auVar69);
  dVar2 = dVar2 * dVar3;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = dVar2;
  auVar68 = vmulsd_avx512f(auVar484,auVar252);
  auVar69 = vfmadd213sd_fma(auVar68,auVar208,auVar69);
  auVar307._8_8_ = 0;
  auVar307._0_8_ = dVar66 * auVar67._0_8_;
  auVar69 = vfmadd213sd_fma(auVar307,auVar330,auVar69);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = dVar1 * dVar2;
  auVar69 = vfmadd213sd_fma(auVar209,auVar285,auVar69);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar69 = vfnmadd231sd_avx512f(auVar69,auVar508,auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar170,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar139,auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar112,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar430,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar408,auVar39);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c2,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar286._8_8_ = 0;
  auVar286._0_8_ = dVar1;
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar140._8_8_ = 0;
  auVar140._0_8_ = dVar2;
  dVar6 = (dVar1 + dVar1) * dVar2;
  dVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar210._8_8_ = 0;
  auVar210._0_8_ = dVar4;
  dVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar171._8_8_ = 0;
  auVar171._0_8_ = dVar5;
  auVar67 = vmulsd_avx512f(auVar286,ZEXT816(0xc000000000000000));
  dVar2 = auVar67._0_8_ * dVar2;
  auVar393._8_8_ = 0;
  auVar393._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar409._8_8_ = 0;
  auVar409._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = dVar6 * dVar3;
  auVar379._8_8_ = 0;
  auVar379._0_8_ = dVar2 * dVar4 * dVar5;
  auVar69 = vfmadd231sd_fma(auVar379,auVar393,auVar331);
  dVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar332._8_8_ = 0;
  auVar332._0_8_ = dVar5;
  auVar431._8_8_ = 0;
  auVar431._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar443._8_8_ = 0;
  auVar443._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = dVar6 * dVar5;
  auVar69 = vfmadd213sd_fma(auVar308,auVar431,auVar69);
  dVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar452._8_8_ = 0;
  auVar452._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = dVar2 * dVar6;
  auVar69 = vfmadd213sd_fma(auVar361,auVar452,auVar69);
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar309._8_8_ = 0;
  auVar309._0_8_ = dVar2;
  dVar66 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[1];
  auVar469._8_8_ = 0;
  auVar469._0_8_ = dVar66;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar1 + dVar1;
  auVar68 = vmulsd_avx512f(auVar113,auVar469);
  auVar498._8_8_ = 0;
  auVar498._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar68 = vmulsd_avx512f(auVar68,auVar498);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar431,auVar69);
  auVar287._8_8_ = 0;
  auVar287._0_8_ = dVar6 * dVar66 * auVar67._0_8_;
  auVar69 = vfmadd213sd_avx512f(auVar287,auVar443,auVar69);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar362._8_8_ = 0;
  auVar362._0_8_ = dVar1;
  dVar7 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar485._8_8_ = 0;
  auVar485._0_8_ = dVar7;
  auVar67 = vaddsd_avx512f(auVar485,auVar485);
  auVar68 = vmulsd_avx512f(auVar140,auVar67);
  auVar513._8_8_ = 0;
  auVar513._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar68 = vmulsd_avx512f(auVar513,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar393,auVar69);
  auVar486._8_8_ = 0;
  auVar486._0_8_ = dVar7;
  auVar68 = vmulsd_avx512f(auVar486,ZEXT816(0xc000000000000000));
  auVar70 = vmulsd_avx512f(auVar140,auVar68);
  auVar70 = vmulsd_avx512f(auVar210,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar409,auVar69);
  auVar288._8_8_ = 0;
  auVar288._0_8_ = dVar3 * auVar68._0_8_ * dVar2;
  auVar69 = vfmadd213sd_avx512f(auVar288,auVar409,auVar69);
  auVar67 = vmulsd_avx512f(auVar67,auVar309);
  auVar67 = vmulsd_avx512f(auVar513,auVar67);
  auVar69 = vfmadd213sd_fma(auVar67,auVar171,auVar69);
  auVar67 = vmulsd_avx512f(auVar362,ZEXT816(0xc000000000000000));
  auVar68 = vmulsd_avx512f(auVar469,auVar67);
  auVar68 = vmulsd_avx512f(auVar332,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar443,auVar69);
  dVar1 = dVar1 + dVar1;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = dVar66 * dVar1;
  auVar68 = vmulsd_avx512f(auVar498,auVar410);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar452,auVar69);
  dVar66 = dVar2 * auVar67._0_8_;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = dVar3 * dVar66;
  auVar69 = vfmadd213sd_fma(auVar253,auVar393,auVar69);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = dVar1 * dVar2 * dVar4;
  auVar69 = vfmadd213sd_fma(auVar211,auVar171,auVar69);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = dVar5 * dVar66;
  auVar69 = vfmadd213sd_fma(auVar172,auVar431,auVar69);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = dVar6 * dVar1 * dVar2;
  auVar69 = vfmadd213sd_fma(auVar212,auVar452,auVar69);
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar254._8_8_ = 0;
  auVar254._0_8_ = dVar2 + dVar2;
  auVar69 = vfmadd213sd_fma(auVar254,auVar309,auVar69);
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar173._8_8_ = 0;
  auVar173._0_8_ = dVar2 + dVar2;
  auVar69 = vfmadd213sd_fma(auVar173,auVar140,auVar69);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar113,auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = dVar1;
  auVar69 = vfmadd231sd_fma(auVar69,auVar363,auVar41);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c2,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar310._8_8_ = 0;
  auVar310._0_8_ = dVar1;
  dVar1 = dVar1 + dVar1;
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar141._8_8_ = 0;
  auVar141._0_8_ = dVar2;
  dVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar213._8_8_ = 0;
  auVar213._0_8_ = dVar3;
  auVar255._8_8_ = 0;
  auVar255._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar289._8_8_ = 0;
  auVar289._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar380._8_8_ = 0;
  auVar380._0_8_ = dVar4;
  dVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar174._8_8_ = 0;
  auVar174._0_8_ = dVar5;
  auVar67 = vmulsd_avx512f(auVar310,ZEXT816(0xc000000000000000));
  dVar66 = auVar67._0_8_ * dVar2;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = dVar1 * dVar2 * dVar3;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = dVar66 * dVar4 * dVar5;
  auVar69 = vfmadd231sd_fma(auVar411,auVar289,auVar364);
  dVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar365._8_8_ = 0;
  auVar365._0_8_ = dVar5;
  auVar432._8_8_ = 0;
  auVar432._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar444._8_8_ = 0;
  auVar444._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = dVar5 * dVar1 * dVar2;
  auVar69 = vfmadd213sd_fma(auVar333,auVar444,auVar69);
  dVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar412._8_8_ = 0;
  auVar412._0_8_ = dVar6;
  auVar453._8_8_ = 0;
  auVar453._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = dVar66 * dVar6;
  auVar69 = vfmadd213sd_fma(auVar394,auVar453,auVar69);
  dVar66 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[0];
  auVar334._8_8_ = 0;
  auVar334._0_8_ = dVar66;
  dVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar470._8_8_ = 0;
  auVar470._0_8_ = dVar7;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = dVar6 * auVar67._0_8_ * dVar66;
  auVar69 = vfmadd213sd_fma(auVar311,auVar432,auVar69);
  auVar395._8_8_ = 0;
  auVar395._0_8_ = dVar1 * dVar66;
  auVar487._8_8_ = 0;
  auVar487._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar67 = vmulsd_avx512f(auVar395,auVar487);
  auVar69 = vfmadd213sd_fma(auVar67,auVar444,auVar69);
  dVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar312._8_8_ = 0;
  auVar312._0_8_ = dVar6;
  dVar8 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar499._8_8_ = 0;
  auVar499._0_8_ = dVar8;
  auVar67 = vmulsd_avx512f(auVar499,ZEXT816(0xc000000000000000));
  auVar68 = vmulsd_avx512f(auVar67,auVar470);
  auVar70 = vmulsd_avx512f(auVar213,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar289,auVar69);
  auVar500._8_8_ = 0;
  auVar500._0_8_ = dVar8;
  auVar70 = vaddsd_avx512f(auVar499,auVar500);
  auVar71 = vmulsd_avx512f(auVar70,auVar470);
  auVar72 = vmulsd_avx512f(auVar380,auVar71);
  auVar69 = vfmadd213sd_avx512f(auVar72,auVar174,auVar69);
  auVar68 = vmulsd_avx512f(auVar365,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar444,auVar69);
  auVar68 = vmulsd_avx512f(auVar412,auVar71);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar453,auVar69);
  auVar67 = vmulsd_avx512f(auVar334,auVar67);
  auVar366._8_8_ = 0;
  auVar366._0_8_ = dVar5 * auVar67._0_8_;
  auVar69 = vfmadd213sd_fma(auVar366,auVar432,auVar69);
  auVar335._8_8_ = 0;
  auVar335._0_8_ = auVar70._0_8_ * dVar66;
  auVar67 = vmulsd_avx512f(auVar487,auVar335);
  auVar69 = vfmadd213sd_fma(auVar67,auVar453,auVar69);
  auVar67 = vmulsd_avx512f(auVar312,ZEXT816(0xc000000000000000));
  auVar381._8_8_ = 0;
  auVar381._0_8_ = dVar4 * auVar67._0_8_ * dVar2;
  auVar69 = vfmadd213sd_fma(auVar381,auVar255,auVar69);
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar336._8_8_ = 0;
  auVar336._0_8_ = dVar4 * dVar2 * (dVar6 + dVar6);
  auVar69 = vfmadd213sd_fma(auVar336,auVar289,auVar69);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = dVar3 * dVar7 * auVar67._0_8_;
  auVar69 = vfmadd213sd_fma(auVar214,auVar255,auVar69);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = dVar4 * dVar7 * (dVar6 + dVar6);
  auVar69 = vfmadd213sd_fma(auVar256,auVar174,auVar69);
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar215._8_8_ = 0;
  auVar215._0_8_ = dVar2 + dVar2;
  auVar69 = vfmadd213sd_fma(auVar215,auVar470,auVar69);
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar175._8_8_ = 0;
  auVar175._0_8_ = dVar2 + dVar2;
  auVar69 = vfmadd213sd_fma(auVar175,auVar141,auVar69);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar1;
  auVar69 = vfmadd231sd_fma(auVar69,auVar114,auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar70,auVar43);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c2,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar1;
  auVar67 = vxorpd_avx512vl(auVar115,local_48);
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar142._8_8_ = 0;
  auVar142._0_8_ = dVar2;
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar176._8_8_ = 0;
  auVar176._0_8_ = dVar3;
  dVar66 = auVar67._0_8_ * dVar3;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar382._8_8_ = 0;
  auVar382._0_8_ = dVar4;
  auVar257._8_8_ = 0;
  auVar257._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar216._8_8_ = 0;
  auVar216._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  dVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar337._8_8_ = 0;
  auVar337._0_8_ = dVar5;
  dVar6 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar413._8_8_ = 0;
  auVar413._0_8_ = dVar6;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = dVar66 * dVar4;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = dVar6 * dVar1 * dVar3 * dVar5;
  auVar69 = vfmadd231sd_fma(auVar454,auVar216,auVar290);
  dVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar445._8_8_ = 0;
  auVar445._0_8_ = dVar6;
  auVar313._8_8_ = 0;
  auVar313._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar291._8_8_ = 0;
  auVar291._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = dVar66 * dVar6;
  auVar69 = vfmadd213sd_fma(auVar471,auVar291,auVar69);
  dVar66 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[4];
  auVar367._8_8_ = 0;
  auVar367._0_8_ = dVar66;
  auVar455._8_8_ = 0;
  auVar455._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = dVar1 * dVar3 * dVar66;
  auVar69 = vfmadd213sd_fma(auVar433,auVar455,auVar69);
  dVar7 = auVar67._0_8_ * dVar2;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = dVar4 * dVar7;
  auVar69 = vfmadd213sd_fma(auVar472,auVar257,auVar69);
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar434._8_8_ = 0;
  auVar434._0_8_ = dVar1 * dVar2;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = dVar4;
  auVar67 = vmulsd_avx512f(auVar434,auVar488);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar413,auVar69);
  auVar396._8_8_ = 0;
  auVar396._0_8_ = dVar6 * dVar7;
  auVar69 = vfmadd213sd_avx512f(auVar396,auVar313,auVar69);
  dVar1 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar473._8_8_ = 0;
  auVar473._0_8_ = dVar1;
  auVar67 = vmulsd_avx512f(auVar434,auVar473);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar455,auVar69);
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar397._8_8_ = 0;
  auVar397._0_8_ = dVar2;
  auVar435._8_8_ = 0;
  auVar435._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  dVar6 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar67 = vxorpd_avx512vl(auVar435,local_48);
  auVar509._8_8_ = 0;
  auVar509._0_8_ = dVar6;
  auVar68 = vmulsd_avx512f(auVar509,auVar67);
  auVar70 = vmulsd_avx512f(auVar382,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar216,auVar69);
  auVar70 = vmulsd_avx512f(auVar435,auVar509);
  auVar71 = vmulsd_avx512f(auVar337,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar71,auVar413,auVar69);
  auVar68 = vmulsd_avx512f(auVar445,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar291,auVar69);
  auVar68 = vmulsd_avx512f(auVar367,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar455,auVar69);
  auVar67 = vmulsd_avx512f(auVar142,auVar67);
  auVar68 = vmulsd_avx512f(auVar337,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar257,auVar69);
  auVar68 = vmulsd_avx512f(auVar142,auVar435);
  auVar70 = vmulsd_avx512f(auVar488,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar216,auVar69);
  auVar68 = vmulsd_avx512f(auVar367,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar313,auVar69);
  auVar67 = vmulsd_avx512f(auVar473,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar291,auVar69);
  auVar67 = vxorpd_avx512vl(auVar397,local_48);
  auVar510._8_8_ = 0;
  auVar510._0_8_ = dVar6;
  auVar68 = vmulsd_avx512f(auVar510,auVar67);
  auVar70 = vmulsd_avx512f(auVar382,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar257,auVar69);
  auVar70 = vmulsd_avx512f(auVar510,auVar397);
  auVar489._8_8_ = 0;
  auVar489._0_8_ = dVar4;
  auVar71 = vmulsd_avx512f(auVar489,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar71,auVar413,auVar69);
  auVar68 = vmulsd_avx512f(auVar445,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar313,auVar69);
  auVar68 = vmulsd_avx512f(auVar473,auVar70);
  auVar69 = vfmadd213sd_fma(auVar68,auVar455,auVar69);
  dVar2 = dVar2 * dVar3;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = dVar2 * dVar5;
  auVar69 = vfmadd213sd_fma(auVar338,auVar257,auVar69);
  auVar67 = vmulsd_avx512f(auVar176,auVar67);
  auVar68 = vmulsd_avx512f(auVar489,auVar67);
  auVar69 = vfmadd213sd_fma(auVar68,auVar216,auVar69);
  auVar258._8_8_ = 0;
  auVar258._0_8_ = dVar66 * auVar67._0_8_;
  auVar69 = vfmadd213sd_fma(auVar258,auVar313,auVar69);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = dVar1 * dVar2;
  auVar69 = vfmadd213sd_fma(auVar217,auVar291,auVar69);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar69 = vfmadd231sd_avx512f(auVar69,auVar510,auVar44);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar176,auVar45);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar142,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar115,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar435,auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar69 = vfnmadd231sd_fma(auVar69,auVar397,auVar49);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c2,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar143._8_8_ = 0;
  auVar143._0_8_ = dVar1;
  auVar67 = vmulsd_avx512f(auVar143,ZEXT816(0xc000000000000000));
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar2;
  dVar66 = auVar67._0_8_ * dVar2;
  dVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar177._8_8_ = 0;
  auVar177._0_8_ = dVar3;
  auVar218._8_8_ = 0;
  auVar218._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar292._8_8_ = 0;
  auVar292._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  dVar1 = dVar1 + dVar1;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar398._8_8_ = 0;
  auVar398._0_8_ = dVar4;
  dVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar259._8_8_ = 0;
  auVar259._0_8_ = dVar5;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = dVar66 * dVar3;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = dVar1 * dVar2 * dVar4 * dVar5;
  auVar69 = vfmadd231sd_fma(auVar414,auVar292,auVar368);
  dVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar369._8_8_ = 0;
  auVar369._0_8_ = dVar5;
  auVar436._8_8_ = 0;
  auVar436._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar446._8_8_ = 0;
  auVar446._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar383._8_8_ = 0;
  auVar383._0_8_ = dVar1 * dVar2 * dVar5;
  auVar69 = vfmadd213sd_fma(auVar383,auVar446,auVar69);
  dVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar415._8_8_ = 0;
  auVar415._0_8_ = dVar6;
  auVar456._8_8_ = 0;
  auVar456._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = dVar6 * dVar66;
  auVar69 = vfmadd213sd_fma(auVar339,auVar456,auVar69);
  dVar66 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[0];
  auVar384._8_8_ = 0;
  auVar384._0_8_ = dVar66;
  dVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar474._8_8_ = 0;
  auVar474._0_8_ = dVar7;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = dVar6 * dVar66 * auVar67._0_8_;
  auVar69 = vfmadd213sd_fma(auVar314,auVar436,auVar69);
  auVar340._8_8_ = 0;
  auVar340._0_8_ = dVar66 * dVar1;
  auVar490._8_8_ = 0;
  auVar490._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar67 = vmulsd_avx512f(auVar340,auVar490);
  auVar69 = vfmadd213sd_fma(auVar67,auVar446,auVar69);
  dVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar315._8_8_ = 0;
  auVar315._0_8_ = dVar6;
  dVar8 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar501._8_8_ = 0;
  auVar501._0_8_ = dVar8;
  auVar67 = vmulsd_avx512f(auVar501,ZEXT816(0xc000000000000000));
  auVar68 = vmulsd_avx512f(auVar67,auVar474);
  auVar70 = vmulsd_avx512f(auVar177,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar292,auVar69);
  auVar502._8_8_ = 0;
  auVar502._0_8_ = dVar8;
  auVar70 = vaddsd_avx512f(auVar501,auVar502);
  auVar71 = vmulsd_avx512f(auVar70,auVar474);
  auVar72 = vmulsd_avx512f(auVar398,auVar71);
  auVar69 = vfmadd213sd_avx512f(auVar72,auVar259,auVar69);
  auVar71 = vmulsd_avx512f(auVar369,auVar71);
  auVar69 = vfmadd213sd_avx512f(auVar71,auVar446,auVar69);
  auVar68 = vmulsd_avx512f(auVar415,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar456,auVar69);
  auVar341._8_8_ = 0;
  auVar341._0_8_ = dVar5 * dVar66 * auVar70._0_8_;
  auVar69 = vfmadd213sd_fma(auVar341,auVar436,auVar69);
  auVar68 = vmulsd_avx512f(auVar384,auVar67);
  auVar68 = vmulsd_avx512f(auVar490,auVar68);
  auVar69 = vfmadd213sd_fma(auVar68,auVar456,auVar69);
  auVar385._8_8_ = 0;
  auVar385._0_8_ = dVar4 * dVar2 * (dVar6 + dVar6);
  auVar69 = vfmadd213sd_fma(auVar385,auVar218,auVar69);
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar68 = vmulsd_avx512f(auVar315,ZEXT816(0xc000000000000000));
  auVar399._8_8_ = 0;
  auVar399._0_8_ = dVar2 * auVar68._0_8_ * dVar4;
  auVar69 = vfmadd213sd_fma(auVar399,auVar292,auVar69);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = dVar3 * dVar7 * auVar68._0_8_;
  auVar69 = vfmadd213sd_fma(auVar178,auVar218,auVar69);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = dVar4 * dVar7 * (dVar6 + dVar6);
  auVar69 = vfmadd213sd_fma(auVar219,auVar259,auVar69);
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar260._8_8_ = 0;
  auVar260._0_8_ = dVar2 + dVar2;
  auVar69 = vfmadd213sd_fma(auVar260,auVar474,auVar69);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar68 = vmulsd_avx512f(ZEXT816(0xc000000000000000),auVar50);
  auVar69 = vfmadd213sd_fma(auVar68,auVar116,auVar69);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = dVar1;
  auVar69 = vfmadd231sd_fma(auVar69,auVar144,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar69 = vfmadd231sd_avx512f(auVar69,auVar67,auVar52);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c2,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar145._8_8_ = 0;
  auVar145._0_8_ = dVar1;
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar117._8_8_ = 0;
  auVar117._0_8_ = dVar2;
  dVar6 = (dVar1 + dVar1) * dVar2;
  dVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar261._8_8_ = 0;
  auVar261._0_8_ = dVar3;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar220._8_8_ = 0;
  auVar220._0_8_ = dVar4;
  dVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar179._8_8_ = 0;
  auVar179._0_8_ = dVar5;
  auVar67 = vmulsd_avx512f(auVar145,ZEXT816(0xc000000000000000));
  dVar2 = auVar67._0_8_ * dVar2;
  auVar400._8_8_ = 0;
  auVar400._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar416._8_8_ = 0;
  auVar416._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = dVar6 * dVar3;
  auVar386._8_8_ = 0;
  auVar386._0_8_ = dVar2 * dVar4 * dVar5;
  auVar69 = vfmadd231sd_fma(auVar386,auVar400,auVar342);
  dVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar343._8_8_ = 0;
  auVar343._0_8_ = dVar5;
  auVar437._8_8_ = 0;
  auVar437._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar447._8_8_ = 0;
  auVar447._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = dVar2 * dVar5;
  auVar69 = vfmadd213sd_fma(auVar370,auVar437,auVar69);
  dVar2 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar457._8_8_ = 0;
  auVar457._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = dVar2 * dVar6;
  auVar69 = vfmadd213sd_fma(auVar316,auVar457,auVar69);
  dVar6 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar371._8_8_ = 0;
  auVar371._0_8_ = dVar6;
  dVar66 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[1];
  auVar475._8_8_ = 0;
  auVar475._0_8_ = dVar66;
  auVar68 = vmulsd_avx512f(auVar67,auVar475);
  auVar491._8_8_ = 0;
  auVar491._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar68 = vmulsd_avx512f(auVar68,auVar491);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar437,auVar69);
  auVar293._8_8_ = 0;
  auVar293._0_8_ = dVar2 * dVar66 * (dVar1 + dVar1);
  auVar69 = vfmadd213sd_avx512f(auVar293,auVar447,auVar69);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar317._8_8_ = 0;
  auVar317._0_8_ = dVar1;
  dVar7 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar503._8_8_ = 0;
  auVar503._0_8_ = dVar7;
  auVar68 = vaddsd_avx512f(auVar503,auVar503);
  auVar70 = vmulsd_avx512f(auVar117,auVar68);
  auVar514._8_8_ = 0;
  auVar514._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar70 = vmulsd_avx512f(auVar514,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar400,auVar69);
  auVar504._8_8_ = 0;
  auVar504._0_8_ = dVar7;
  auVar70 = vmulsd_avx512f(auVar504,ZEXT816(0xc000000000000000));
  auVar71 = vmulsd_avx512f(auVar117,auVar70);
  auVar71 = vmulsd_avx512f(auVar220,auVar71);
  auVar69 = vfmadd213sd_avx512f(auVar71,auVar416,auVar69);
  auVar68 = vmulsd_avx512f(auVar68,auVar371);
  auVar68 = vmulsd_avx512f(auVar261,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar416,auVar69);
  auVar294._8_8_ = 0;
  auVar294._0_8_ = dVar6 * auVar70._0_8_;
  auVar68 = vmulsd_avx512f(auVar514,auVar294);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar179,auVar69);
  auVar68 = vmulsd_avx512f(auVar317,ZEXT816(0xc000000000000000));
  auVar70 = vmulsd_avx512f(auVar475,auVar68);
  auVar70 = vmulsd_avx512f(auVar343,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar447,auVar69);
  dVar1 = dVar1 + dVar1;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = dVar66 * dVar1;
  auVar70 = vmulsd_avx512f(auVar491,auVar318);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar457,auVar69);
  auVar262._8_8_ = 0;
  auVar262._0_8_ = dVar6 * dVar1 * dVar3;
  auVar69 = vfmadd213sd_fma(auVar262,auVar400,auVar69);
  dVar3 = dVar6 * auVar68._0_8_;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = dVar4 * dVar3;
  auVar69 = vfmadd213sd_fma(auVar221,auVar179,auVar69);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = dVar5 * dVar3;
  auVar69 = vfmadd213sd_fma(auVar180,auVar437,auVar69);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = dVar2 * dVar6 * dVar1;
  auVar69 = vfmadd213sd_fma(auVar222,auVar457,auVar69);
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar68 = vmulsd_avx512f(ZEXT816(0xc000000000000000),auVar53);
  auVar69 = vfmadd213sd_fma(auVar68,auVar371,auVar69);
  dVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar181._8_8_ = 0;
  auVar181._0_8_ = dVar2 + dVar2;
  auVar69 = vfmadd213sd_fma(auVar181,auVar117,auVar69);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar67,auVar54);
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = dVar1;
  auVar69 = vfmadd231sd_fma(auVar69,auVar295,auVar55);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c2,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar182._8_8_ = 0;
  auVar182._0_8_ = dVar1;
  auVar67 = vmulsd_avx512f(auVar182,ZEXT816(0xc000000000000000));
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar146._8_8_ = 0;
  auVar146._0_8_ = dVar2;
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar118._8_8_ = 0;
  auVar118._0_8_ = dVar3;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  dVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar183._8_8_ = 0;
  auVar183._0_8_ = dVar5;
  dVar6 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar372._8_8_ = 0;
  auVar372._0_8_ = dVar6;
  auVar387._8_8_ = 0;
  auVar387._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar401._8_8_ = 0;
  auVar401._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = auVar67._0_8_ * dVar3 * dVar4;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = dVar6 * (dVar1 + dVar1) * dVar3 * dVar5;
  auVar69 = vfmadd231sd_fma(auVar344,auVar387,auVar263);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = dVar4 * (dVar1 + dVar1) * dVar2;
  auVar69 = vfmadd213sd_fma(auVar264,auVar401,auVar69);
  dVar1 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar223._8_8_ = 0;
  auVar223._0_8_ = auVar67._0_8_ * dVar2 * dVar1;
  auVar69 = vfmadd213sd_fma(auVar223,auVar372,auVar69);
  dVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar265._8_8_ = 0;
  auVar265._0_8_ = dVar4;
  dVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar319._8_8_ = 0;
  auVar319._0_8_ = dVar6;
  dVar66 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[2];
  auVar373._8_8_ = 0;
  auVar373._0_8_ = dVar66;
  dVar7 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar438._8_8_ = 0;
  auVar438._0_8_ = dVar7;
  auVar448._8_8_ = 0;
  auVar448._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar458._8_8_ = 0;
  auVar458._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = dVar66 * (dVar6 + dVar6) * dVar7;
  auVar69 = vfmadd213sd_fma(auVar417,auVar448,auVar69);
  dVar7 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  auVar224._8_8_ = 0;
  auVar224._0_8_ = dVar7;
  auVar476._8_8_ = 0;
  auVar476._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar67 = vmulsd_avx512f(auVar319,ZEXT816(0xc000000000000000));
  auVar68 = vmulsd_avx512f(auVar67,auVar373);
  auVar68 = vmulsd_avx512f(auVar68,auVar224);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar476,auVar69);
  dVar3 = dVar3 * auVar67._0_8_;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = dVar1 * dVar3;
  auVar69 = vfmadd213sd_avx512f(auVar418,auVar387,auVar69);
  auVar345._8_8_ = 0;
  auVar345._0_8_ = dVar6 + dVar6;
  auVar67 = vmulsd_avx512f(auVar118,auVar345);
  auVar68 = vmulsd_avx512f(auVar183,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar401,auVar69);
  dVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar419._8_8_ = 0;
  auVar419._0_8_ = dVar6;
  auVar67 = vmulsd_avx512f(auVar67,auVar419);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar448,auVar69);
  auVar320._8_8_ = 0;
  auVar320._0_8_ = dVar3 * dVar7;
  auVar69 = vfmadd213sd_avx512f(auVar320,auVar458,auVar69);
  auVar67 = vmulsd_avx512f(auVar265,ZEXT816(0xc000000000000000));
  auVar68 = vmulsd_avx512f(auVar373,auVar67);
  auVar68 = vmulsd_avx512f(auVar438,auVar68);
  auVar69 = vfmadd213sd_fma(auVar68,auVar458,auVar69);
  auVar321._8_8_ = 0;
  auVar321._0_8_ = dVar6 * dVar66 * (dVar4 + dVar4);
  auVar69 = vfmadd213sd_fma(auVar321,auVar476,auVar69);
  auVar68 = vmulsd_avx512f(auVar146,auVar67);
  auVar296._8_8_ = 0;
  auVar296._0_8_ = auVar68._0_8_ * dVar1;
  auVar69 = vfmadd213sd_fma(auVar296,auVar387,auVar69);
  dVar2 = dVar2 * (dVar4 + dVar4);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = dVar5 * dVar2;
  auVar69 = vfmadd213sd_fma(auVar184,auVar401,auVar69);
  auVar266._8_8_ = 0;
  auVar266._0_8_ = dVar6 * dVar2;
  auVar69 = vfmadd213sd_fma(auVar266,auVar448,auVar69);
  auVar185._8_8_ = 0;
  auVar185._0_8_ = auVar68._0_8_ * dVar7;
  auVar69 = vfmadd213sd_fma(auVar185,auVar458,auVar69);
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar225._8_8_ = 0;
  auVar225._0_8_ = dVar1 + dVar1;
  auVar69 = vfmadd213sd_fma(auVar225,auVar146,auVar69);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar68 = vmulsd_avx512f(ZEXT816(0xc000000000000000),auVar56);
  auVar69 = vfmadd213sd_fma(auVar68,auVar118,auVar69);
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar345,auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar69 = vfmadd231sd_avx512f(auVar69,auVar67,auVar58);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c2,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  dVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar119._8_8_ = 0;
  auVar119._0_8_ = dVar1;
  dVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar147._8_8_ = 0;
  auVar147._0_8_ = dVar2;
  dVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar186._8_8_ = 0;
  auVar186._0_8_ = dVar3;
  dVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar402._8_8_ = 0;
  auVar402._0_8_ = dVar4;
  auVar267._8_8_ = 0;
  auVar267._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar226._8_8_ = 0;
  auVar226._0_8_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  dVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar322._8_8_ = 0;
  auVar322._0_8_ = dVar5;
  dVar6 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar388._8_8_ = 0;
  auVar388._0_8_ = dVar6;
  auVar67 = vxorpd_avx512vl(auVar119,local_48);
  dVar66 = auVar67._0_8_ * dVar3;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = dVar1 * dVar3 * dVar4;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = dVar6 * dVar66 * dVar5;
  auVar69 = vfmadd231sd_fma(auVar459,auVar226,auVar297);
  dVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  auVar346._8_8_ = 0;
  auVar346._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
  ;
  auVar298._8_8_ = 0;
  auVar298._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = dVar66 * dVar4;
  auVar69 = vfmadd213sd_fma(auVar477,auVar298,auVar69);
  dVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  auVar374._8_8_ = 0;
  auVar374._0_8_ = dVar6;
  auVar460._8_8_ = 0;
  auVar460._0_8_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
  ;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = dVar1 * dVar3 * dVar6;
  auVar69 = vfmadd213sd_fma(auVar420,auVar460,auVar69);
  auVar478._8_8_ = 0;
  auVar478._0_8_ = dVar1 * dVar2;
  auVar68 = vmulsd_avx512f(auVar402,auVar478);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar267,auVar69);
  dVar1 = (l02->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  dVar66 = auVar67._0_8_ * dVar2;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = dVar66;
  auVar505._8_8_ = 0;
  auVar505._0_8_ = dVar1;
  auVar67 = vmulsd_avx512f(auVar421,auVar505);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar388,auVar69);
  auVar422._8_8_ = 0;
  auVar422._0_8_ = dVar4 * dVar66;
  auVar69 = vfmadd213sd_fma(auVar422,auVar346,auVar69);
  dVar66 = (l01->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[3];
  auVar492._8_8_ = 0;
  auVar492._0_8_ = dVar66;
  auVar67 = vmulsd_avx512f(auVar478,auVar492);
  auVar69 = vfmadd213sd_fma(auVar67,auVar460,auVar69);
  dVar7 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  auVar423._8_8_ = 0;
  auVar423._0_8_ = dVar7;
  dVar8 = (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  auVar439._8_8_ = 0;
  auVar439._0_8_ = dVar8;
  dVar9 = (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  auVar67 = vxorpd_avx512vl(auVar439,local_48);
  auVar511._8_8_ = 0;
  auVar511._0_8_ = dVar9;
  auVar68 = vmulsd_avx512f(auVar511,auVar67);
  auVar70 = vmulsd_avx512f(auVar402,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar70,auVar226,auVar69);
  auVar70 = vmulsd_avx512f(auVar439,auVar511);
  auVar71 = vmulsd_avx512f(auVar322,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar71,auVar388,auVar69);
  auVar479._8_8_ = 0;
  auVar479._0_8_ = dVar4 * auVar70._0_8_;
  auVar69 = vfmadd213sd_avx512f(auVar479,auVar298,auVar69);
  auVar68 = vmulsd_avx512f(auVar374,auVar68);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar460,auVar69);
  auVar480._8_8_ = 0;
  auVar480._0_8_ = dVar8 * dVar2;
  auVar68 = vmulsd_avx512f(auVar322,auVar480);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar267,auVar69);
  auVar67 = vmulsd_avx512f(auVar147,auVar67);
  auVar68 = vmulsd_avx512f(auVar505,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar68,auVar226,auVar69);
  auVar67 = vmulsd_avx512f(auVar374,auVar67);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar346,auVar69);
  auVar67 = vmulsd_avx512f(auVar492,auVar480);
  auVar69 = vfmadd213sd_avx512f(auVar67,auVar298,auVar69);
  auVar67 = vxorpd_avx512vl(auVar423,local_48);
  auVar512._8_8_ = 0;
  auVar512._0_8_ = dVar9;
  auVar68 = vmulsd_avx512f(auVar512,auVar67);
  auVar70 = vmulsd_avx512f(auVar402,auVar68);
  auVar69 = vfmadd213sd_fma(auVar70,auVar267,auVar69);
  auVar70 = vmulsd_avx512f(auVar512,auVar423);
  auVar506._8_8_ = 0;
  auVar506._0_8_ = dVar1;
  auVar71 = vmulsd_avx512f(auVar506,auVar70);
  auVar69 = vfmadd213sd_avx512f(auVar71,auVar388,auVar69);
  auVar389._8_8_ = 0;
  auVar389._0_8_ = dVar4 * auVar70._0_8_;
  auVar69 = vfmadd213sd_avx512f(auVar389,auVar346,auVar69);
  auVar493._8_8_ = 0;
  auVar493._0_8_ = dVar66;
  auVar68 = vmulsd_avx512f(auVar493,auVar68);
  auVar69 = vfmadd213sd_fma(auVar68,auVar460,auVar69);
  auVar67 = vmulsd_avx512f(auVar186,auVar67);
  auVar323._8_8_ = 0;
  auVar323._0_8_ = auVar67._0_8_ * dVar5;
  auVar69 = vfmadd213sd_fma(auVar323,auVar267,auVar69);
  dVar7 = dVar7 * dVar3;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = dVar7;
  auVar68 = vmulsd_avx512f(auVar506,auVar268);
  auVar69 = vfmadd213sd_fma(auVar68,auVar226,auVar69);
  auVar269._8_8_ = 0;
  auVar269._0_8_ = dVar6 * dVar7;
  auVar69 = vfmadd213sd_fma(auVar269,auVar346,auVar69);
  auVar67 = vmulsd_avx512f(auVar493,auVar67);
  auVar69 = vfmadd213sd_fma(auVar67,auVar298,auVar69);
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar69 = vfmadd231sd_avx512f(auVar69,auVar512,auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar186,auVar60);
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       (l12->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar147,auVar61);
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar119,auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar439,auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
  ;
  auVar69 = vfmadd231sd_fma(auVar69,auVar423,auVar64);
  local_50 = auVar69._0_8_;
  iVar65._M_current =
       (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar65._M_current ==
      (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(c2,iVar65,&local_50);
  }
  else {
    *iVar65._M_current = local_50;
    (c2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar65._M_current + 1;
  }
  return;
}

Assistant:

void
opengv::relative_pose::modules::sixpt::fillRow1(
    const Eigen::Matrix<double,6,1> & l01,
    const Eigen::Matrix<double,6,1> & l02,
    const Eigen::Matrix<double,6,1> & l11,
    const Eigen::Matrix<double,6,1> & l12,
    std::vector<double> & c0,
    std::vector<double> & c1,
    std::vector<double> & c2 )
{
  c0.push_back(-l12[2]*l11[1]*l01[0]+l12[2]*l11[0]*l01[1]+l12[1]*l11[2]*l01[0]-l12[1]*l11[0]*l01[2]+l12[0]*l11[2]*l01[1]-l12[0]*l11[1]*l01[2]);
  c0.push_back(2*l12[1]*l11[2]*l01[1]-2*l12[1]*l11[1]*l01[2]-2*l12[0]*l11[2]*l01[0]+2*l12[0]*l11[0]*l01[2]);
  c0.push_back(-l12[2]*l11[1]*l01[0]+l12[2]*l11[0]*l01[1]-l12[1]*l11[2]*l01[0]+l12[1]*l11[0]*l01[2]-l12[0]*l11[2]*l01[1]+l12[0]*l11[1]*l01[2]);
  c0.push_back(2*l12[2]*l11[2]*l01[1]-2*l12[2]*l11[1]*l01[2]+2*l12[0]*l11[1]*l01[0]-2*l12[0]*l11[0]*l01[1]);
  c0.push_back(-2*l12[2]*l11[2]*l01[0]+2*l12[2]*l11[0]*l01[2]+2*l12[1]*l11[1]*l01[0]-2*l12[1]*l11[0]*l01[1]);
  c0.push_back(l12[2]*l11[1]*l01[0]-l12[2]*l11[0]*l01[1]+l12[1]*l11[2]*l01[0]-l12[1]*l11[0]*l01[2]-l12[0]*l11[2]*l01[1]+l12[0]*l11[1]*l01[2]);
  c0.push_back(-2*l12[2]*l11[2]*l01[0]+2*l12[2]*l11[0]*l01[2]-2*l12[1]*l11[1]*l01[0]+2*l12[1]*l11[0]*l01[1]);
  c0.push_back(-2*l12[2]*l11[2]*l01[1]+2*l12[2]*l11[1]*l01[2]+2*l12[0]*l11[1]*l01[0]-2*l12[0]*l11[0]*l01[1]);
  c0.push_back(2*l12[1]*l11[2]*l01[1]-2*l12[1]*l11[1]*l01[2]+2*l12[0]*l11[2]*l01[0]-2*l12[0]*l11[0]*l01[2]);
  c0.push_back(l12[2]*l11[1]*l01[0]-l12[2]*l11[0]*l01[1]-l12[1]*l11[2]*l01[0]+l12[1]*l11[0]*l01[2]+l12[0]*l11[2]*l01[1]-l12[0]*l11[1]*l01[2]);
  c1.push_back(l12[2]*l11[1]*l02[0]+l12[2]*l11[0]*l02[1]-l12[1]*l11[2]*l02[0]-l12[1]*l11[0]*l02[2]+l12[0]*l11[2]*l02[1]-l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[1]*l02[1]-2*l12[2]*l11[0]*l02[0]-2*l12[1]*l11[1]*l02[2]+2*l12[0]*l11[0]*l02[2]);
  c1.push_back(-l12[2]*l11[1]*l02[0]-l12[2]*l11[0]*l02[1]-l12[1]*l11[2]*l02[0]+l12[1]*l11[0]*l02[2]+l12[0]*l11[2]*l02[1]+l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[2]*l02[1]-2*l12[1]*l11[2]*l02[2]+2*l12[1]*l11[0]*l02[0]-2*l12[0]*l11[0]*l02[1]);
  c1.push_back(-2*l12[2]*l11[2]*l02[0]+2*l12[1]*l11[1]*l02[0]+2*l12[0]*l11[2]*l02[2]-2*l12[0]*l11[1]*l02[1]);
  c1.push_back(l12[2]*l11[1]*l02[0]-l12[2]*l11[0]*l02[1]+l12[1]*l11[2]*l02[0]+l12[1]*l11[0]*l02[2]-l12[0]*l11[2]*l02[1]-l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[2]*l02[0]+2*l12[1]*l11[1]*l02[0]-2*l12[0]*l11[2]*l02[2]-2*l12[0]*l11[1]*l02[1]);
  c1.push_back(2*l12[2]*l11[2]*l02[1]-2*l12[1]*l11[2]*l02[2]-2*l12[1]*l11[0]*l02[0]+2*l12[0]*l11[0]*l02[1]);
  c1.push_back(-2*l12[2]*l11[1]*l02[1]-2*l12[2]*l11[0]*l02[0]+2*l12[1]*l11[1]*l02[2]+2*l12[0]*l11[0]*l02[2]);
  c1.push_back(-l12[2]*l11[1]*l02[0]+l12[2]*l11[0]*l02[1]+l12[1]*l11[2]*l02[0]-l12[1]*l11[0]*l02[2]-l12[0]*l11[2]*l02[1]+l12[0]*l11[1]*l02[2]);
  c2.push_back(-l12[2]*l11[1]*l02[5]*l02[1]+l12[2]*l11[1]*l02[4]*l02[2]+l12[2]*l11[1]*l01[5]*l01[1]-l12[2]*l11[1]*l01[4]*l01[2]+l12[2]*l11[0]*l02[5]*l02[0]-l12[2]*l11[0]*l02[3]*l02[2]+l12[2]*l11[0]*l01[5]*l01[0]-l12[2]*l11[0]*l01[3]*l01[2]+l12[1]*l11[2]*l02[5]*l02[1]-l12[1]*l11[2]*l02[4]*l02[2]-l12[1]*l11[2]*l01[5]*l01[1]+l12[1]*l11[2]*l01[4]*l01[2]+l12[1]*l11[0]*l02[4]*l02[0]-l12[1]*l11[0]*l02[3]*l02[1]+l12[1]*l11[0]*l01[4]*l01[0]-l12[1]*l11[0]*l01[3]*l01[1]+l12[0]*l11[2]*l02[5]*l02[0]-l12[0]*l11[2]*l02[3]*l02[2]+l12[0]*l11[2]*l01[5]*l01[0]-l12[0]*l11[2]*l01[3]*l01[2]+l12[0]*l11[1]*l02[4]*l02[0]-l12[0]*l11[1]*l02[3]*l02[1]+l12[0]*l11[1]*l01[4]*l01[0]-l12[0]*l11[1]*l01[3]*l01[1]-l12[5]*l11[2]-l12[4]*l11[1]+l12[3]*l11[0]-l12[2]*l11[5]-l12[1]*l11[4]+l12[0]*l11[3]);
  c2.push_back(2*l12[2]*l11[1]*l02[5]*l02[0]-2*l12[2]*l11[1]*l02[3]*l02[2]+2*l12[2]*l11[0]*l02[5]*l02[1]-2*l12[2]*l11[0]*l02[4]*l02[2]+2*l12[1]*l11[2]*l01[5]*l01[0]-2*l12[1]*l11[2]*l01[3]*l01[2]+2*l12[1]*l11[1]*l02[4]*l02[0]-2*l12[1]*l11[1]*l02[3]*l02[1]+2*l12[1]*l11[1]*l01[4]*l01[0]-2*l12[1]*l11[1]*l01[3]*l01[1]+2*l12[0]*l11[2]*l01[5]*l01[1]-2*l12[0]*l11[2]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[4]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[1]-2*l12[0]*l11[0]*l01[4]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[1]+2*l12[4]*l11[0]+2*l12[3]*l11[1]+2*l12[1]*l11[3]+2*l12[0]*l11[4]);
  c2.push_back(l12[2]*l11[1]*l02[5]*l02[1]-l12[2]*l11[1]*l02[4]*l02[2]+l12[2]*l11[1]*l01[5]*l01[1]-l12[2]*l11[1]*l01[4]*l01[2]-l12[2]*l11[0]*l02[5]*l02[0]+l12[2]*l11[0]*l02[3]*l02[2]+l12[2]*l11[0]*l01[5]*l01[0]-l12[2]*l11[0]*l01[3]*l01[2]+l12[1]*l11[2]*l02[5]*l02[1]-l12[1]*l11[2]*l02[4]*l02[2]+l12[1]*l11[2]*l01[5]*l01[1]-l12[1]*l11[2]*l01[4]*l01[2]-l12[1]*l11[0]*l02[4]*l02[0]+l12[1]*l11[0]*l02[3]*l02[1]-l12[1]*l11[0]*l01[4]*l01[0]+l12[1]*l11[0]*l01[3]*l01[1]+l12[0]*l11[2]*l02[5]*l02[0]-l12[0]*l11[2]*l02[3]*l02[2]-l12[0]*l11[2]*l01[5]*l01[0]+l12[0]*l11[2]*l01[3]*l01[2]-l12[0]*l11[1]*l02[4]*l02[0]+l12[0]*l11[1]*l02[3]*l02[1]-l12[0]*l11[1]*l01[4]*l01[0]+l12[0]*l11[1]*l01[3]*l01[1]-l12[5]*l11[2]+l12[4]*l11[1]-l12[3]*l11[0]-l12[2]*l11[5]+l12[1]*l11[4]-l12[0]*l11[3]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[0]-2*l12[2]*l11[2]*l02[3]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[0]-2*l12[2]*l11[2]*l01[3]*l01[2]+2*l12[2]*l11[1]*l01[4]*l01[0]-2*l12[2]*l11[1]*l01[3]*l01[1]+2*l12[1]*l11[2]*l02[4]*l02[0]-2*l12[1]*l11[2]*l02[3]*l02[1]-2*l12[1]*l11[0]*l02[5]*l02[1]+2*l12[1]*l11[0]*l02[4]*l02[2]-2*l12[0]*l11[1]*l01[5]*l01[1]+2*l12[0]*l11[1]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[5]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[2]-2*l12[0]*l11[0]*l01[5]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[2]+2*l12[5]*l11[0]+2*l12[3]*l11[2]+2*l12[2]*l11[3]+2*l12[0]*l11[5]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[1]-2*l12[2]*l11[2]*l02[4]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[1]-2*l12[2]*l11[2]*l01[4]*l01[2]-2*l12[2]*l11[0]*l01[4]*l01[0]+2*l12[2]*l11[0]*l01[3]*l01[1]-2*l12[1]*l11[1]*l02[5]*l02[1]+2*l12[1]*l11[1]*l02[4]*l02[2]-2*l12[1]*l11[1]*l01[5]*l01[1]+2*l12[1]*l11[1]*l01[4]*l01[2]-2*l12[1]*l11[0]*l01[5]*l01[0]+2*l12[1]*l11[0]*l01[3]*l01[2]-2*l12[0]*l11[2]*l02[4]*l02[0]+2*l12[0]*l11[2]*l02[3]*l02[1]-2*l12[0]*l11[1]*l02[5]*l02[0]+2*l12[0]*l11[1]*l02[3]*l02[2]+2*l12[5]*l11[1]+2*l12[4]*l11[2]+2*l12[2]*l11[4]+2*l12[1]*l11[5]);
  c2.push_back(-l12[2]*l11[1]*l02[5]*l02[1]+l12[2]*l11[1]*l02[4]*l02[2]-l12[2]*l11[1]*l01[5]*l01[1]+l12[2]*l11[1]*l01[4]*l01[2]-l12[2]*l11[0]*l02[5]*l02[0]+l12[2]*l11[0]*l02[3]*l02[2]-l12[2]*l11[0]*l01[5]*l01[0]+l12[2]*l11[0]*l01[3]*l01[2]-l12[1]*l11[2]*l02[5]*l02[1]+l12[1]*l11[2]*l02[4]*l02[2]-l12[1]*l11[2]*l01[5]*l01[1]+l12[1]*l11[2]*l01[4]*l01[2]-l12[1]*l11[0]*l02[4]*l02[0]+l12[1]*l11[0]*l02[3]*l02[1]+l12[1]*l11[0]*l01[4]*l01[0]-l12[1]*l11[0]*l01[3]*l01[1]-l12[0]*l11[2]*l02[5]*l02[0]+l12[0]*l11[2]*l02[3]*l02[2]-l12[0]*l11[2]*l01[5]*l01[0]+l12[0]*l11[2]*l01[3]*l01[2]+l12[0]*l11[1]*l02[4]*l02[0]-l12[0]*l11[1]*l02[3]*l02[1]-l12[0]*l11[1]*l01[4]*l01[0]+l12[0]*l11[1]*l01[3]*l01[1]+l12[5]*l11[2]-l12[4]*l11[1]-l12[3]*l11[0]+l12[2]*l11[5]-l12[1]*l11[4]-l12[0]*l11[3]);
  c2.push_back(-2*l12[2]*l11[2]*l02[5]*l02[1]+2*l12[2]*l11[2]*l02[4]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[1]-2*l12[2]*l11[2]*l01[4]*l01[2]-2*l12[2]*l11[0]*l01[4]*l01[0]+2*l12[2]*l11[0]*l01[3]*l01[1]-2*l12[1]*l11[1]*l02[5]*l02[1]+2*l12[1]*l11[1]*l02[4]*l02[2]+2*l12[1]*l11[1]*l01[5]*l01[1]-2*l12[1]*l11[1]*l01[4]*l01[2]+2*l12[1]*l11[0]*l01[5]*l01[0]-2*l12[1]*l11[0]*l01[3]*l01[2]+2*l12[0]*l11[2]*l02[4]*l02[0]-2*l12[0]*l11[2]*l02[3]*l02[1]-2*l12[0]*l11[1]*l02[5]*l02[0]+2*l12[0]*l11[1]*l02[3]*l02[2]+2*l12[5]*l11[1]-2*l12[4]*l11[2]+2*l12[2]*l11[4]-2*l12[1]*l11[5]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[0]-2*l12[2]*l11[2]*l02[3]*l02[2]-2*l12[2]*l11[2]*l01[5]*l01[0]+2*l12[2]*l11[2]*l01[3]*l01[2]-2*l12[2]*l11[1]*l01[4]*l01[0]+2*l12[2]*l11[1]*l01[3]*l01[1]+2*l12[1]*l11[2]*l02[4]*l02[0]-2*l12[1]*l11[2]*l02[3]*l02[1]+2*l12[1]*l11[0]*l02[5]*l02[1]-2*l12[1]*l11[0]*l02[4]*l02[2]-2*l12[0]*l11[1]*l01[5]*l01[1]+2*l12[0]*l11[1]*l01[4]*l01[2]+2*l12[0]*l11[0]*l02[5]*l02[0]-2*l12[0]*l11[0]*l02[3]*l02[2]-2*l12[0]*l11[0]*l01[5]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[2]-2*l12[5]*l11[0]+2*l12[3]*l11[2]-2*l12[2]*l11[3]+2*l12[0]*l11[5]);
  c2.push_back(-2*l12[2]*l11[1]*l02[5]*l02[0]+2*l12[2]*l11[1]*l02[3]*l02[2]+2*l12[2]*l11[0]*l02[5]*l02[1]-2*l12[2]*l11[0]*l02[4]*l02[2]+2*l12[1]*l11[2]*l01[5]*l01[0]-2*l12[1]*l11[2]*l01[3]*l01[2]-2*l12[1]*l11[1]*l02[4]*l02[0]+2*l12[1]*l11[1]*l02[3]*l02[1]+2*l12[1]*l11[1]*l01[4]*l01[0]-2*l12[1]*l11[1]*l01[3]*l01[1]-2*l12[0]*l11[2]*l01[5]*l01[1]+2*l12[0]*l11[2]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[4]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[1]+2*l12[0]*l11[0]*l01[4]*l01[0]-2*l12[0]*l11[0]*l01[3]*l01[1]+2*l12[4]*l11[0]-2*l12[3]*l11[1]+2*l12[1]*l11[3]-2*l12[0]*l11[4]);
  c2.push_back(l12[2]*l11[1]*l02[5]*l02[1]-l12[2]*l11[1]*l02[4]*l02[2]-l12[2]*l11[1]*l01[5]*l01[1]+l12[2]*l11[1]*l01[4]*l01[2]+l12[2]*l11[0]*l02[5]*l02[0]-l12[2]*l11[0]*l02[3]*l02[2]-l12[2]*l11[0]*l01[5]*l01[0]+l12[2]*l11[0]*l01[3]*l01[2]-l12[1]*l11[2]*l02[5]*l02[1]+l12[1]*l11[2]*l02[4]*l02[2]+l12[1]*l11[2]*l01[5]*l01[1]-l12[1]*l11[2]*l01[4]*l01[2]+l12[1]*l11[0]*l02[4]*l02[0]-l12[1]*l11[0]*l02[3]*l02[1]-l12[1]*l11[0]*l01[4]*l01[0]+l12[1]*l11[0]*l01[3]*l01[1]-l12[0]*l11[2]*l02[5]*l02[0]+l12[0]*l11[2]*l02[3]*l02[2]+l12[0]*l11[2]*l01[5]*l01[0]-l12[0]*l11[2]*l01[3]*l01[2]-l12[0]*l11[1]*l02[4]*l02[0]+l12[0]*l11[1]*l02[3]*l02[1]+l12[0]*l11[1]*l01[4]*l01[0]-l12[0]*l11[1]*l01[3]*l01[1]+l12[5]*l11[2]+l12[4]*l11[1]+l12[3]*l11[0]+l12[2]*l11[5]+l12[1]*l11[4]+l12[0]*l11[3]);
}